

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes2.cc
# Opt level: O0

int __thiscall Node::IsNumber(Node *this)

{
  int iVar1;
  VariableStruct *pVVar2;
  VariableStruct *ThisVar;
  Node *this_local;
  
  iVar1 = this->Type;
  if (iVar1 != 0x2a) {
    if (iVar1 == 0x2b) {
      iVar1 = IsNumber(this->Tree[0]);
      return iVar1;
    }
    if (((((iVar1 != 0x2d) && (iVar1 != 0x2f)) && (iVar1 != 0x3c)) &&
        ((iVar1 != 0x3e && (iVar1 != 0x5e)))) && ((iVar1 != 0x165 && (iVar1 != 0x1c7)))) {
      if (iVar1 != 0x1cd) {
        if (iVar1 - 0x1ceU < 3) {
          return 1;
        }
        if (iVar1 != 0x1d3) {
          if (iVar1 - 0x1e2U < 8) {
            return 1;
          }
          if (iVar1 - 0x1ebU < 4) {
            return 1;
          }
          if (iVar1 - 0x1f0U < 2) {
            return 1;
          }
          return 0;
        }
      }
      pVVar2 = VariableList::Lookup(Variables,&this->TextValue,this->Tree[0],0);
      if ((pVVar2 != (VariableStruct *)0x0) && (pVVar2->Type - VARTYPE_BYTE < 10)) {
        return 1;
      }
      return 0;
    }
  }
  return 1;
}

Assistant:

int Node::IsNumber(void)
{
	VariableStruct *ThisVar;

	//
	// Try to figure out the variable type
	//
	switch (Type)
	{
	case BAS_V_FUNCTION:
	case BAS_V_NAME:
		//
		// Look for variable in table
		//
		ThisVar = Variables->Lookup(TextValue, Tree[0]);

		//
		// Print this variable
		//
		if (ThisVar != 0)
		{
			switch (ThisVar->Type)
			{
			case VARTYPE_BYTE:
			case VARTYPE_WORD:
			case VARTYPE_INTEGER:
			case VARTYPE_LONG:
			case VARTYPE_SINGLE:
			case VARTYPE_REAL:
			case VARTYPE_DOUBLE:
			case VARTYPE_HFLOAT:
			case VARTYPE_GFLOAT:
			case VARTYPE_DECIMAL:
				return 1;

			}
		}
		return 0;

	//
	// Sometomes used for strings.
	//
	case '+':
		return Tree[0]->IsNumber();

	//
	// Always Numeric
	//
	case '-':
	case '*':
	case '/':
	case '>':
	case '<':
	case BAS_S_MOD:
	case '^':
	case BAS_X_LAND:
	case BAS_S_EQV:
	case BAS_S_IMP:
	case BAS_X_GE:
	case BAS_X_LE:
	case BAS_P_NAME:
	case BAS_X_EQ:
	case BAS_X_NEQ:
	case BAS_S_NOT:
	case BAS_X_LNOT:
	case BAS_X_LOR:
	case BAS_S_OR:
	case BAS_N_UMINUS:
	case BAS_N_UPLUS:
	case BAS_S_XOR:
		return 1;

	// Easily a number
	//
	case BAS_V_INT:
	case BAS_V_INTEGER:
	case BAS_V_FLOAT:
		return(1);

	//
	// I don't know
	//
	default:
		return(0);
	}
}